

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaValidateOneElement(xmlSchemaValidCtxtPtr ctxt,xmlNodePtr elem)

{
  int iVar1;
  
  if (((elem != (xmlNodePtr)0x0 && ctxt != (xmlSchemaValidCtxtPtr)0x0) &&
      (elem->type == XML_ELEMENT_NODE)) && (ctxt->schema != (xmlSchemaPtr)0x0)) {
    ctxt->doc = elem->doc;
    ctxt->node = elem;
    ctxt->validationRoot = elem;
    iVar1 = xmlSchemaVStart(ctxt);
    return iVar1;
  }
  return -1;
}

Assistant:

int
xmlSchemaValidateOneElement(xmlSchemaValidCtxtPtr ctxt, xmlNodePtr elem)
{
    if ((ctxt == NULL) || (elem == NULL) || (elem->type != XML_ELEMENT_NODE))
	return (-1);

    if (ctxt->schema == NULL)
	return (-1);

    ctxt->doc = elem->doc;
    ctxt->node = elem;
    ctxt->validationRoot = elem;
    return(xmlSchemaVStart(ctxt));
}